

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

uint64_t nuts_clock(void)

{
  uint64_t uVar1;
  timeval local_28;
  
  if (nuts_clock::epoch == 0) {
    nuts_clock::epoch = time((time_t *)0x0);
  }
  uVar1 = 0;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  if (nuts_clock::epoch <= local_28.tv_sec) {
    uVar1 = local_28.tv_usec / 1000 + (local_28.tv_sec - nuts_clock::epoch) * 1000;
  }
  return uVar1;
}

Assistant:

uint64_t
nuts_clock(void)
{
#ifdef _WIN32
	return (GetTickCount64());
#elif defined(CLOCK_MONTONIC)
	struct timespec ts;
	clock_gettime(CLOCK_MONOTONIC, &ts);
	uint64_t val;

	val = ts.tv_sec;
	val *= 1000;
	val += ts.tv_nsec / 1000000;
	return (val);
#else
	static time_t  epoch;
	struct timeval tv;

	if (epoch == 0) {
		epoch = time(NULL);
	}
	gettimeofday(&tv, NULL);

	if (tv.tv_sec < epoch) {
		// Broken clock.
		// This will force all other timing tests to fail
		return (0);
	}
	tv.tv_sec -= epoch;
	return (
	    ((uint64_t) (tv.tv_sec) * 1000) + (uint64_t) (tv.tv_usec / 1000));
#endif

#ifdef _WIN32
#else
#include <fcntl.h>
#include <unistd.h>
#endif
}